

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Makowski.hpp
# Opt level: O2

HRRDoubletStep * __thiscall
Makowski_HRR::DoubletStep_
          (HRRDoubletStep *__return_storage_ptr__,Makowski_HRR *this,Doublet *target,
          RRStepType steptype)

{
  Gaussian *pGVar1;
  Gaussian *pGVar2;
  Gaussian *this_00;
  int iVar3;
  runtime_error *this_01;
  XYZStep XVar4;
  Gaussian *this_02;
  Gaussian GVar5;
  reverse_iterator<const_int_*> it;
  ExpList ijk;
  undefined1 local_124 [4];
  string tag;
  undefined1 local_100 [64];
  Gaussian *local_c0;
  reverse_iterator<const_int_*> local_b8;
  Doublet src1d;
  Doublet src2d;
  
  std::__cxx11::string::string((string *)&tag,(string *)&target->tag);
  iVar3 = Doublet::am(target);
  if (iVar3 == 0) {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_01,"Cannot HRR step to an s doublet!");
    __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pGVar1 = &target->left;
  pGVar2 = &target->right;
  this_02 = pGVar2;
  this_00 = pGVar1;
  if ((steptype & ~K) == I) {
    this_02 = pGVar1;
    this_00 = pGVar2;
  }
  ijk._M_elems[2] = (this_02->ijk)._M_elems[2];
  ijk._M_elems._0_8_ = *(undefined8 *)(this_02->ijk)._M_elems;
  std::__sort<int*,__gnu_cxx::__ops::_Iter_less_iter>(&ijk,local_124);
  std::
  __find_if<int*,__gnu_cxx::__ops::_Iter_pred<Makowski_HRR::DoubletStep_(Doublet_const&,RRStepType)::_lambda(int)_1_>>
            (&ijk,local_124);
  local_c0 = this_02;
  local_b8.current = (int *)(this_02 + 1);
  std::find<std::reverse_iterator<int_const*>,int>(&it,&local_b8,(int *)&local_c0);
  iVar3 = (int)((ulong)((long)(this_02 + 1) - (long)it.current) >> 2);
  GVar5 = Gaussian::StepDown(this_02,2 - iVar3,1);
  local_100._4_12_ = (undefined1  [12])Gaussian::StepUp(this_00,2 - iVar3,1);
  src1d.tag._M_dataplus._M_p = (pointer)&src1d.tag.field_2;
  src1d.tag._M_string_length = 0;
  src1d.tag.field_2._M_local_buf[0] = '\0';
  src2d.tag._M_string_length = 0;
  src2d.tag._M_dataplus._M_p = (pointer)&src2d.tag.field_2;
  src2d.tag.field_2._M_local_buf[0] = '\0';
  if ((steptype & ~K) == I) {
    local_100._0_4_ = target->type;
    local_100._16_12_ = local_100._4_12_;
    local_100._4_12_ = (undefined1  [12])GVar5;
    std::__cxx11::string::string((string *)(local_100 + 0x20),(string *)&tag);
    Doublet::operator=(&src1d,(Doublet *)local_100);
    std::__cxx11::string::~string((string *)(local_100 + 0x20));
    local_100._0_4_ = target->type;
    local_100._16_12_ = *(undefined1 (*) [12])(pGVar2->ijk)._M_elems;
    local_100._4_12_ = (undefined1  [12])GVar5;
    std::__cxx11::string::string((string *)(local_100 + 0x20),(string *)&tag);
  }
  else {
    local_100._0_4_ = target->type;
    local_100._16_12_ = (undefined1  [12])GVar5;
    std::__cxx11::string::string((string *)(local_100 + 0x20),(string *)&tag);
    Doublet::operator=(&src1d,(Doublet *)local_100);
    std::__cxx11::string::~string((string *)(local_100 + 0x20));
    local_100._0_4_ = target->type;
    local_100._4_12_ = *(undefined1 (*) [12])(pGVar1->ijk)._M_elems;
    local_100._16_12_ = (undefined1  [12])GVar5;
    std::__cxx11::string::string((string *)(local_100 + 0x20),(string *)&tag);
  }
  Doublet::operator=(&src2d,(Doublet *)local_100);
  std::__cxx11::string::~string((string *)(local_100 + 0x20));
  __return_storage_ptr__->type = steptype;
  Doublet::Doublet(&__return_storage_ptr__->target,target);
  Doublet::Doublet((__return_storage_ptr__->src)._M_elems,&src1d);
  Doublet::Doublet((__return_storage_ptr__->src)._M_elems + 1,&src2d);
  XVar4 = STEP_X;
  if (iVar3 != 2) {
    XVar4 = (iVar3 != 1) + STEP_Y;
  }
  __return_storage_ptr__->xyz = XVar4;
  std::__cxx11::string::~string((string *)&src2d.tag);
  std::__cxx11::string::~string((string *)&src1d.tag);
  std::__cxx11::string::~string((string *)&tag);
  return __return_storage_ptr__;
}

Assistant:

virtual HRRDoubletStep DoubletStep_(const Doublet & target, RRStepType steptype)
        {
            const std::string tag = target.tag;

            if(target.am() == 0)
                throw std::runtime_error("Cannot HRR step to an s doublet!");

            const Gaussian * t;
            const Gaussian * t2;

            if(steptype == RRStepType::I || steptype == RRStepType::K)  // Going J->I or L->K
            {
                t = &target.left;
                t2 = &target.right;
            }
            else // Going I->J or K->L
            {
                t = &target.right;
                t2 = &target.left;
            }
                

            // idx is the xyz index
            ExpList ijk = t->ijk;
            std::sort(ijk.begin(), ijk.end());
            auto v = std::find_if(ijk.begin(), ijk.end(), [](int i) { return i != 0; });
            auto it = std::find(t->ijk.rbegin(), t->ijk.rend(), *v); 
            int idx = 2 - std::distance(t->ijk.rbegin(), it);  // remember we are working with reverse iterators

            // gaussian common to both src1 and src2
            Gaussian common(t->StepDown(idx, 1));

            // for src1
            Gaussian src1g(t2->StepUp(idx, 1));

            // create new doublets
            Doublet src1d, src2d;
            if(steptype == RRStepType::I || steptype == RRStepType::K)
            {
                src1d = Doublet{target.type, common, src1g, tag};
                src2d = Doublet{target.type, common, target.right, tag};
            }
            else
            {
                src1d = Doublet{target.type, src1g, common, tag};
                src2d = Doublet{target.type, target.left, common, tag};
            }
           
            XYZStep xyzstep = IdxToXYZStep(idx);

            // Create the HRR doublet step
            HRRDoubletStep hrr{steptype,
                               target, 
                               src1d, src2d,
                               xyzstep};
            return hrr;
        }